

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int memdbOpen(sqlite3_vfs *pVfs,char *zName,sqlite3_file *pFd,int flags,int *pOutFlags)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  sqlite3_mutex *psVar4;
  sqlite3_io_methods *p;
  void *pvVar5;
  sqlite3_mutex *psVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  
  pFd->pMethods = (sqlite3_io_methods *)0x0;
  pFd[1].pMethods = (sqlite3_io_methods *)0x0;
  pFd[2].pMethods = (sqlite3_io_methods *)0x0;
  if (zName == (char *)0x0) {
    uVar9 = 0;
  }
  else {
    sVar3 = strlen(zName);
    uVar9 = (uint)sVar3 & 0x3fffffff;
  }
  if ((uVar9 < 2) || ((*zName != '\\' && (*zName != '/')))) {
    p = (sqlite3_io_methods *)sqlite3Malloc(0x48);
    if (p == (sqlite3_io_methods *)0x0) {
      return 7;
    }
    p->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
    p->xSync = (_func_int_sqlite3_file_ptr_int *)0x0;
    p->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)0x0;
    p->xLock = (_func_int_sqlite3_file_ptr_int *)0x0;
    p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
    p->xWrite = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
    *(undefined8 *)p = 0;
    p->xClose = (_func_int_sqlite3_file_ptr *)0x0;
    p->xUnlock = (_func_int_sqlite3_file_ptr_int *)0x0;
    *(undefined4 *)((long)&p->xSync + 4) = 3;
    p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)sqlite3Config.mxMemdbSize;
    goto LAB_0013645a;
  }
  if (sqlite3Config.bCoreMutex == '\0') {
    psVar4 = (sqlite3_mutex *)0x0;
  }
  else {
    psVar4 = (*sqlite3Config.mutex.xMutexAlloc)(0xb);
  }
  if (psVar4 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar4);
  }
  pvVar5 = memdb_g_1;
  lVar8 = (long)memdb_g_0;
  if (0 < lVar8) {
    lVar7 = 0;
    do {
      p = *(sqlite3_io_methods **)((long)pvVar5 + lVar7 * 8);
      iVar2 = strcmp((char *)p->xUnlock,zName);
      if (iVar2 == 0) goto LAB_00136314;
      lVar7 = lVar7 + 1;
    } while (lVar8 != lVar7);
  }
  p = (sqlite3_io_methods *)0x0;
LAB_00136314:
  if (p == (sqlite3_io_methods *)0x0) {
    p = (sqlite3_io_methods *)sqlite3Malloc((ulong)(uVar9 + 0x4b));
    if (p != (sqlite3_io_methods *)0x0) {
      pvVar5 = sqlite3Realloc(memdb_g_1,(long)memdb_g_0 * 8 + 8);
      if (pvVar5 != (void *)0x0) {
        lVar8 = (long)memdb_g_0;
        memdb_g_0 = memdb_g_0 + 1;
        *(sqlite3_io_methods **)((long)pvVar5 + lVar8 * 8) = p;
        memdb_g_1 = pvVar5;
        p->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
        p->xSync = (_func_int_sqlite3_file_ptr_int *)0x0;
        p->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)0x0;
        p->xLock = (_func_int_sqlite3_file_ptr_int *)0x0;
        p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
        p->xWrite = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
        *(undefined8 *)p = 0;
        p->xClose = (_func_int_sqlite3_file_ptr *)0x0;
        p->xUnlock = (_func_int_sqlite3_file_ptr_int *)0x0;
        *(undefined4 *)((long)&p->xSync + 4) = 3;
        p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)
                   sqlite3Config.mxMemdbSize;
        p->xUnlock = (_func_int_sqlite3_file_ptr_int *)&p->xCheckReservedLock;
        memcpy(&p->xCheckReservedLock,zName,(ulong)(uVar9 + 1));
        iVar2 = sqlite3_initialize();
        if (iVar2 == 0) {
          psVar6 = (*sqlite3Config.mutex.xMutexAlloc)(0);
        }
        else {
          psVar6 = (sqlite3_mutex *)0x0;
        }
        p->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)psVar6;
        if (psVar6 != (sqlite3_mutex *)0x0) {
          *(undefined4 *)&p->xLock = 1;
          (*sqlite3Config.mutex.xMutexEnter)(psVar6);
          goto LAB_0013633c;
        }
        memdb_g_0 = memdb_g_0 + -1;
      }
      sqlite3_free(p);
    }
    bVar1 = false;
  }
  else {
    if ((sqlite3_mutex *)p->xTruncate != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)p->xTruncate);
    }
    *(int *)&p->xLock = *(int *)&p->xLock + 1;
LAB_0013633c:
    bVar1 = true;
  }
  if (psVar4 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar4);
  }
  if (!bVar1) {
    return 7;
  }
LAB_0013645a:
  pFd[1].pMethods = p;
  if (pOutFlags != (int *)0x0) {
    *pOutFlags = flags | 0x80;
  }
  pFd->pMethods = &memdb_io_methods;
  if ((sqlite3_mutex *)p->xTruncate != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)p->xTruncate);
  }
  return 0;
}

Assistant:

static int memdbOpen(
  sqlite3_vfs *pVfs,
  const char *zName,
  sqlite3_file *pFd,
  int flags,
  int *pOutFlags
){
  MemFile *pFile = (MemFile*)pFd;
  MemStore *p = 0;
  int szName;
  UNUSED_PARAMETER(pVfs);

  memset(pFile, 0, sizeof(*pFile));
  szName = sqlite3Strlen30(zName);
  if( szName>1 && (zName[0]=='/' || zName[0]=='\\') ){
    int i;
#ifndef SQLITE_MUTEX_OMIT
    sqlite3_mutex *pVfsMutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_VFS1);
#endif
    sqlite3_mutex_enter(pVfsMutex);
    for(i=0; i<memdb_g.nMemStore; i++){
      if( strcmp(memdb_g.apMemStore[i]->zFName,zName)==0 ){
        p = memdb_g.apMemStore[i];
        break;
      }
    }
    if( p==0 ){
      MemStore **apNew;
      p = sqlite3Malloc( sizeof(*p) + szName + 3 );
      if( p==0 ){
        sqlite3_mutex_leave(pVfsMutex);
        return SQLITE_NOMEM;
      }
      apNew = sqlite3Realloc(memdb_g.apMemStore,
                             sizeof(apNew[0])*(memdb_g.nMemStore+1) );
      if( apNew==0 ){
        sqlite3_free(p);
        sqlite3_mutex_leave(pVfsMutex);
        return SQLITE_NOMEM;
      }
      apNew[memdb_g.nMemStore++] = p;
      memdb_g.apMemStore = apNew;
      memset(p, 0, sizeof(*p));
      p->mFlags = SQLITE_DESERIALIZE_RESIZEABLE|SQLITE_DESERIALIZE_FREEONCLOSE;
      p->szMax = sqlite3GlobalConfig.mxMemdbSize;
      p->zFName = (char*)&p[1];
      memcpy(p->zFName, zName, szName+1);
      p->pMutex = sqlite3_mutex_alloc(SQLITE_MUTEX_FAST);
      if( p->pMutex==0 ){
        memdb_g.nMemStore--;
        sqlite3_free(p);
        sqlite3_mutex_leave(pVfsMutex);
        return SQLITE_NOMEM;
      }
      p->nRef = 1;
      memdbEnter(p);
    }else{
      memdbEnter(p);
      p->nRef++;
    }
    sqlite3_mutex_leave(pVfsMutex);
  }else{
    p = sqlite3Malloc( sizeof(*p) );
    if( p==0 ){
      return SQLITE_NOMEM;
    }
    memset(p, 0, sizeof(*p));
    p->mFlags = SQLITE_DESERIALIZE_RESIZEABLE | SQLITE_DESERIALIZE_FREEONCLOSE;
    p->szMax = sqlite3GlobalConfig.mxMemdbSize;
  }
  pFile->pStore = p;
  if( pOutFlags!=0 ){
    *pOutFlags = flags | SQLITE_OPEN_MEMORY;
  }
  pFd->pMethods = &memdb_io_methods;
  memdbLeave(p);
  return SQLITE_OK;
}